

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcTestCaseWrapper.cpp
# Opt level: O0

bool __thiscall deqp::TestCaseWrapper::initTestCase(TestCaseWrapper *this,TestCase *testCase)

{
  RenderContext *renderCtx;
  ContextInfo *ctxInfo;
  bad_alloc *anon_var_0;
  ResourceError *e_1;
  NotSupportedError *e_2;
  InternalError *e_3;
  Exception *e_4;
  exception *e;
  bool success;
  TestLog *log;
  TestCase *testCase_local;
  TestCaseWrapper *this_local;
  
  tcu::TestContext::getLog(this->m_testCtx);
  renderCtx = deqp::Context::getRenderContext(this->m_context);
  ctxInfo = deqp::Context::getContextInfo(this->m_context);
  glu::resetState(renderCtx,ctxInfo);
  (*(testCase->super_TestNode)._vptr_TestNode[2])();
  return true;
}

Assistant:

bool TestCaseWrapper::initTestCase(tcu::TestCase* testCase)
{
	TestLog& log	 = m_testCtx.getLog();
	bool	 success = false;

	try
	{
		// Clear state to defaults
		glu::resetState(m_context.getRenderContext(), m_context.getContextInfo());
	}
	catch (const std::exception& e)
	{
		log << e;
		log << TestLog::Message << "Error in state reset, test program will terminate." << TestLog::EndMessage;
		return false;
	}

	try
	{
		testCase->init();
		success = true;
	}
	catch (const std::bad_alloc&)
	{
		DE_ASSERT(!success);
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Failed to allocate memory in test case init");
	}
	catch (const tcu::ResourceError& e)
	{
		DE_ASSERT(!success);
		m_testCtx.setTestResult(QP_TEST_RESULT_RESOURCE_ERROR, "Resource error in test case init");
		log << e;
	}
	catch (const tcu::NotSupportedError& e)
	{
		DE_ASSERT(!success);
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not supported");
		log << e;
	}
	catch (const tcu::InternalError& e)
	{
		DE_ASSERT(!success);
		m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Internal error in test case init");
		log << e;
	}
	catch (const tcu::Exception& e)
	{
		DE_ASSERT(!success);
		log << e;
	}

	if (!success)
	{
		if (m_testCtx.getTestResult() == QP_TEST_RESULT_LAST)
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Error in test case init");
		return false;
	}

	return true;
}